

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O2

void __thiscall
rlottie::internal::renderer::Group::processPaintItems
          (Group *this,
          vector<rlottie::internal::renderer::Shape_*,_std::allocator<rlottie::internal::renderer::Shape_*>_>
          *list)

{
  pointer ppSVar1;
  pointer ppSVar2;
  Paint *this_00;
  uint uVar3;
  Paint *in_RAX;
  __normal_iterator<rlottie::internal::renderer::Object_**,_std::vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>_>
  __tmp;
  pointer ppOVar4;
  Shape *pathItem;
  Paint *local_38;
  
  ppSVar1 = (list->
            super__Vector_base<rlottie::internal::renderer::Shape_*,_std::allocator<rlottie::internal::renderer::Shape_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  ppSVar2 = (list->
            super__Vector_base<rlottie::internal::renderer::Shape_*,_std::allocator<rlottie::internal::renderer::Shape_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppOVar4 = (this->mContents).
            super__Vector_base<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = in_RAX;
  while (ppOVar4 !=
         (this->mContents).
         super__Vector_base<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
         ._M_impl.super__Vector_impl_data._M_start) {
    this_00 = (Paint *)ppOVar4[-1];
    ppOVar4 = ppOVar4 + -1;
    uVar3 = (*(this_00->super_Object)._vptr_Object[5])(this_00);
    if ((char)uVar3 == '\x01') {
      processPaintItems((Group *)this_00,list);
    }
    else if ((uVar3 & 0xff) == 3) {
      Paint::addPathItems(this_00,list,(long)ppSVar1 - (long)ppSVar2 >> 3);
    }
    else if ((uVar3 & 0xff) == 2) {
      (this_00->mPathItems).
      super__Vector_base<rlottie::internal::renderer::Shape_*,_std::allocator<rlottie::internal::renderer::Shape_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
      local_38 = this_00;
      std::
      vector<rlottie::internal::renderer::Shape_*,_std::allocator<rlottie::internal::renderer::Shape_*>_>
      ::push_back(list,(value_type *)&local_38);
    }
  }
  return;
}

Assistant:

void renderer::Group::processPaintItems(std::vector<renderer::Shape *> &list)
{
    size_t curOpCount = list.size();
    for (auto i = mContents.rbegin(); i != mContents.rend(); ++i) {
        auto content = (*i);
        switch (content->type()) {
        case renderer::Object::Type::Shape: {
            auto pathItem = static_cast<renderer::Shape *>(content);
            pathItem->setParent(this);
            list.push_back(pathItem);
            break;
        }
        case renderer::Object::Type::Paint: {
            static_cast<renderer::Paint *>(content)->addPathItems(list,
                                                                  curOpCount);
            break;
        }
        case renderer::Object::Type::Group: {
            static_cast<renderer::Group *>(content)->processPaintItems(list);
            break;
        }
        default:
            break;
        }
    }
}